

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O3

double __thiscall despot::Logger::StderrDiscountedRoundReward(Logger *this)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined4 uVar11;
  double dVar12;
  
  pdVar2 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pdVar3 - (long)pdVar2 >> 3;
  dVar8 = 0.0;
  dVar7 = 0.0;
  dVar12 = 0.0;
  if (pdVar3 != pdVar2) {
    lVar6 = 0;
    do {
      dVar1 = pdVar2[lVar6];
      dVar12 = dVar12 + dVar1;
      dVar7 = dVar7 + dVar1 * dVar1;
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  if (0 < (int)lVar5) {
    dVar8 = (double)(int)lVar5;
    auVar9._8_8_ = (dVar12 * dVar12) / dVar8;
    auVar9._0_8_ = dVar7;
    uVar11 = (undefined4)((ulong)dVar8 >> 0x20);
    auVar10._8_4_ = SUB84(dVar8,0);
    auVar10._0_8_ = dVar8;
    auVar10._12_4_ = uVar11;
    auVar10 = divpd(auVar9,auVar10);
    auVar4._8_4_ = SUB84(dVar8,0);
    auVar4._0_8_ = dVar8;
    auVar4._12_4_ = uVar11;
    auVar10 = divpd(auVar10,auVar4);
    dVar8 = auVar10._0_8_ - auVar10._8_8_;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
      return dVar8;
    }
    dVar8 = SQRT(dVar8);
  }
  return dVar8;
}

Assistant:

double Logger::StderrDiscountedRoundReward() const {
	double sum = 0, sum2 = 0;
	for (int i = 0; i < discounted_round_rewards_.size(); i++) {
		double reward = discounted_round_rewards_[i];
		sum += reward;
		sum2 += reward * reward;
	}
	int n = discounted_round_rewards_.size();
	return n > 0 ? sqrt(sum2 / n / n - sum * sum / n / n / n) : 0.0;
}